

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertySkipEntry(char **ppPos,char *pEnd)

{
  char *pcVar1;
  char *local_20;
  char *pPos;
  char *pEnd_local;
  char **ppPos_local;
  
  local_20 = *ppPos;
  if (*local_20 == '\"') {
    do {
      pcVar1 = local_20;
      local_20 = pcVar1 + 1;
      if (pEnd <= local_20) goto LAB_00538da7;
    } while (*local_20 != '\"');
    local_20 = pcVar1 + 2;
  }
  else {
    for (; (((((local_20 < pEnd && (*local_20 != ' ')) && (*local_20 != '\r')) &&
             ((*local_20 != '\n' && (*local_20 != '\t')))) &&
            ((*local_20 != ':' && ((*local_20 != ';' && (*local_20 != '(')))))) &&
           ((*local_20 != ')' && ((*local_20 != '{' && (*local_20 != '}'))))));
        local_20 = local_20 + 1) {
    }
  }
LAB_00538da7:
  *ppPos = local_20;
  return (int)(local_20 == pEnd);
}

Assistant:

static inline int Scl_LibertySkipEntry( char ** ppPos, char * pEnd )
{
    char * pPos = *ppPos;
    if ( *pPos == '\"' )
    {
        for ( pPos++; pPos < pEnd; pPos++ )
            if ( *pPos == '\"' )
            {
                pPos++;
                break;
            }
    }
    else
    {
        for ( ; pPos < pEnd; pPos++ )
            if ( *pPos == ' ' || *pPos == '\r' || *pPos == '\n' || *pPos == '\t' ||
                 *pPos == ':' || *pPos == ';'  || 
                 *pPos == '(' || *pPos == ')'  || 
                 *pPos == '{' || *pPos == '}' )
                break;
    }
    *ppPos = pPos;
    return pPos == pEnd;
}